

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tct3img.cpp
# Opt level: O3

void __thiscall CTcGenTarg::read_sources_from_object_file(CTcGenTarg *this,CVmFile *fp)

{
  long lVar1;
  uint uVar2;
  size_t buflen;
  char b [2];
  ushort local_1028 [2048];
  
  CVmFile::read_bytes(fp,(char *)local_1028,2);
  uVar2 = (uint)local_1028[0];
  if (local_1028[0] != 0) {
    do {
      CVmFile::read_bytes(fp,(char *)local_1028,2);
      buflen = (size_t)local_1028[0];
      if (buflen < 0x1001) {
        CVmFile::read_bytes(fp,(char *)local_1028,buflen);
      }
      else {
        CVmFile::read_bytes(fp,(char *)local_1028,0x1000);
        lVar1 = ftell((FILE *)fp->fp_);
        fseek((FILE *)fp->fp_,buflen + lVar1 + -0x1000,0);
        buflen = 0x1000;
      }
      CTcTokenizer::get_file_desc(G_tok,(char *)local_1028,buflen,1,(char *)local_1028,buflen);
      uVar2 = uVar2 - 1;
    } while (uVar2 != 0);
  }
  return;
}

Assistant:

void CTcGenTarg::read_sources_from_object_file(CVmFile *fp)
{
    uint cnt;
    uint i;

    /* read the number of entries */
    cnt = fp->read_uint2();

    /* read the entries */
    for (i = 0 ; i < cnt ; ++i)
    {
        size_t len;
        char fname[OSFNMAX];

        /* read the length of the entry */
        len = fp->read_uint2();

        /* see if it fits in our buffer */
        if (len <= sizeof(fname))
        {
            /* read it */
            fp->read_bytes(fname, len);
        }
        else
        {
            /* it's too long - truncate to the buffer size */
            fp->read_bytes(fname, sizeof(fname));

            /* skip the rest */
            fp->set_pos(fp->get_pos() + len - sizeof(fname));

            /* note the truncated length */
            len = sizeof(fname);
        }

        /* 
         *   Add it to the tokenizer list.  Always create a new entry,
         *   rather than re-using an existing entry.  When loading
         *   multiple object files, this might result in the same file
         *   appearing as multiple different descriptors, but it's a small
         *   price to pay (it doesn't add too much redundant space to the
         *   image file, and in any case the information is only retained
         *   when we're compiling for debugging) for a big gain in
         *   simplicity (the source references in the object file can be
         *   fixed up simply by adding the object file's base index to all
         *   of the reference indices).  
         */
        G_tok->create_file_desc(fname, len);
    }
}